

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjLoad(jx9_value *pSrc,jx9_value *pDest)

{
  int *piVar1;
  sxu32 *psVar2;
  sxu32 sVar3;
  
  SyMemcpy(pSrc,pDest,0x14);
  if ((pSrc->iFlags & 0x40) != 0) {
    piVar1 = (int *)((pSrc->x).iVal + 0x50);
    *piVar1 = *piVar1 + 1;
  }
  if ((pDest->sBlob).nByte != 0) {
    SyBlobRelease(&pDest->sBlob);
  }
  sVar3 = (pSrc->sBlob).nByte;
  if (sVar3 != 0) {
    (pDest->sBlob).pBlob = (pSrc->sBlob).pBlob;
    (pDest->sBlob).nByte = sVar3;
    (pDest->sBlob).mByte = 0;
    psVar2 = &(pDest->sBlob).nFlags;
    *(byte *)psVar2 = (byte)*psVar2 | 4;
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjLoad(jx9_value *pSrc, jx9_value *pDest)
{
	SyMemcpy((const void *)&(*pSrc), &(*pDest), 
		sizeof(jx9_value)-(sizeof(jx9_vm *)+sizeof(SyBlob)+sizeof(sxu32)));
	if( pSrc->iFlags & MEMOBJ_HASHMAP ){
		/* Increment reference count */
		((jx9_hashmap *)pSrc->x.pOther)->iRef++;
	}
	if( SyBlobLength(&pDest->sBlob) > 0 ){
		SyBlobRelease(&pDest->sBlob);
	}
	if( SyBlobLength(&pSrc->sBlob) > 0 ){
		SyBlobReadOnly(&pDest->sBlob, SyBlobData(&pSrc->sBlob), SyBlobLength(&pSrc->sBlob));
	}
	return SXRET_OK;
}